

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_FSA_non.c
# Opt level: O0

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  UserData data;
  int i;
  sunrealtype *dudata;
  sunrealtype *udata;
  sunrealtype dx;
  sunrealtype hadv;
  sunrealtype hdiff;
  sunrealtype horac;
  sunrealtype hordc;
  sunrealtype urt;
  sunrealtype ult;
  sunrealtype ui;
  int local_74;
  double local_38;
  double local_30;
  
  lVar5 = N_VGetArrayPointer(in_RDI);
  lVar6 = N_VGetArrayPointer(in_RSI);
  dVar1 = (double)in_RDX[1];
  dVar2 = *(double *)*in_RDX;
  dVar3 = *(double *)(*in_RDX + 8);
  for (local_74 = 0; local_74 < 10; local_74 = local_74 + 1) {
    dVar4 = *(double *)(lVar5 + (long)local_74 * 8);
    if (local_74 == 0) {
      local_30 = 0.0;
    }
    else {
      local_30 = *(double *)(lVar5 + (long)(local_74 + -1) * 8);
    }
    if (local_74 == 9) {
      local_38 = 0.0;
    }
    else {
      local_38 = *(double *)(lVar5 + (long)(local_74 + 1) * 8);
    }
    *(double *)(lVar6 + (long)local_74 * 8) =
         (dVar2 / (dVar1 * dVar1)) * ((local_30 - (dVar4 + dVar4)) + local_38) +
         (dVar3 / (dVar1 * 2.0)) * (local_38 - local_30);
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype ui, ult, urt, hordc, horac, hdiff, hadv;
  sunrealtype dx;
  sunrealtype *udata, *dudata;
  int i;
  UserData data;

  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Extract needed problem constants from data */
  data  = (UserData)user_data;
  dx    = data->dx;
  hordc = data->p[0] / (dx * dx);
  horac = data->p[1] / (SUN_RCONST(2.0) * dx);

  /* Loop over all grid points. */
  for (i = 0; i < NEQ; i++)
  {
    /* Extract u at x_i and two neighboring points */
    ui = udata[i];
    if (i != 0) { ult = udata[i - 1]; }
    else { ult = ZERO; }
    if (i != NEQ - 1) { urt = udata[i + 1]; }
    else { urt = ZERO; }

    /* Set diffusion and advection terms and load into udot */
    hdiff     = hordc * (ult - SUN_RCONST(2.0) * ui + urt);
    hadv      = horac * (urt - ult);
    dudata[i] = hdiff + hadv;
  }

  return (0);
}